

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImU32 ImGui::TabBarCalcTabID(ImGuiTabBar *tab_bar,char *label,ImGuiWindow *docked_window)

{
  ImGuiWindow *window;
  ImGuiID id;
  ImGuiWindow *docked_window_local;
  char *label_local;
  ImGuiTabBar *tab_bar_local;
  
  if (docked_window == (ImGuiWindow *)0x0) {
    tab_bar_local._4_4_ = ImGuiWindow::GetID(GImGui->CurrentWindow,label,(char *)0x0);
  }
  else {
    if ((tab_bar->Flags & 0x100000U) == 0) {
      __assert_fail("tab_bar->Flags & ImGuiTabBarFlags_DockNode",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x1d77,
                    "ImU32 ImGui::TabBarCalcTabID(ImGuiTabBar *, const char *, ImGuiWindow *)");
    }
    tab_bar_local._4_4_ = ImHashStr(label,0,0);
    KeepAliveID(tab_bar_local._4_4_);
  }
  return tab_bar_local._4_4_;
}

Assistant:

static ImU32   ImGui::TabBarCalcTabID(ImGuiTabBar* tab_bar, const char* label, ImGuiWindow* docked_window)
{
    if (docked_window != NULL)
    {
        IM_UNUSED(tab_bar);
        IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_DockNode);
        ImGuiID id = ImHashStr(label);
        KeepAliveID(id);
        return id;
    }
    else
    {
        ImGuiWindow* window = GImGui->CurrentWindow;
        return window->GetID(label);
    }
}